

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv__tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uint addrlen,uv_connect_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  sockaddr *addr_00;
  int iVar2;
  int *piVar3;
  ifaddrs *piVar4;
  uint32_t uVar5;
  ifaddrs *ifa;
  sockaddr_in6 tmp6;
  
  if (handle->type != UV_TCP) {
    __assert_fail("handle->type == UV_TCP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/tcp.c"
                  ,0x118,
                  "int uv__tcp_connect(uv_connect_t *, uv_tcp_t *, const struct sockaddr *, unsigned int, uv_connect_cb)"
                 );
  }
  if (handle->connect_req == (uv_connect_t *)0x0) {
    if (handle->delayed_error == 0) {
      iVar2 = maybe_new_socket(handle,(uint)addr->sa_family,0xc000);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = uv__is_ipv6_link_local(addr);
      if (iVar2 != 0) {
        tmp6._0_4_ = *(undefined4 *)addr;
        tmp6.sin6_flowinfo = *(uint32_t *)(addr->sa_data + 2);
        tmp6.sin6_addr.__in6_u.__u6_addr32[0] = *(undefined4 *)(addr->sa_data + 6);
        tmp6.sin6_addr.__in6_u.__u6_addr32[1] = *(undefined4 *)(addr->sa_data + 10);
        tmp6.sin6_addr.__in6_u._8_2_ = addr[1].sa_family;
        tmp6.sin6_addr.__in6_u._10_1_ = addr[1].sa_data[0];
        tmp6.sin6_addr.__in6_u._11_1_ = addr[1].sa_data[1];
        tmp6.sin6_addr.__in6_u.__u6_addr32[3] = *(undefined4 *)(addr[1].sa_data + 2);
        tmp6.sin6_scope_id = *(uint32_t *)(addr[1].sa_data + 6);
        if (tmp6.sin6_scope_id == 0) {
          piVar4 = (ifaddrs *)&ifa;
          iVar2 = getifaddrs(piVar4);
          uVar5 = 0;
          if (iVar2 == 0) {
            do {
              piVar4 = piVar4->ifa_next;
              if (piVar4 == (ifaddrs *)0x0) {
                uVar5 = 0;
                goto LAB_0011e784;
              }
              addr_00 = piVar4->ifa_addr;
            } while ((addr_00 == (sockaddr *)0x0) ||
                    (iVar2 = uv__is_ipv6_link_local(addr_00), iVar2 == 0));
            uVar5 = *(uint32_t *)(addr_00[1].sa_data + 6);
LAB_0011e784:
            freeifaddrs(ifa);
          }
          addr = (sockaddr *)&tmp6;
          tmp6.sin6_scope_id = uVar5;
        }
      }
      piVar3 = __errno_location();
      do {
        *piVar3 = 0;
        iVar2 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
        if (iVar2 != -1) goto LAB_0011e690;
        iVar2 = *piVar3;
      } while (iVar2 == 4);
      if ((iVar2 != 0) && (iVar2 != 0x73)) {
        if (iVar2 != 0x6f) {
          return -iVar2;
        }
        handle->delayed_error = -0x6f;
      }
    }
LAB_0011e690:
    req->loop = handle->loop;
    req->type = UV_CONNECT;
    paVar1 = &handle->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    req->cb = cb;
    req->handle = (uv_stream_t *)handle;
    (req->queue).next = &req->queue;
    (req->queue).prev = &req->queue;
    handle->connect_req = req;
    uv__io_start(handle->loop,&handle->io_watcher,4);
    iVar2 = 0;
    if (handle->delayed_error != 0) {
      uv__io_feed(handle->loop,&handle->io_watcher);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -0x72;
  }
  return iVar2;
}

Assistant:

int uv__tcp_connect(uv_connect_t* req,
                    uv_tcp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen,
                    uv_connect_cb cb) {
  struct sockaddr_in6 tmp6;
  int err;
  int r;

  assert(handle->type == UV_TCP);

  if (handle->connect_req != NULL)
    return UV_EALREADY;  /* FIXME(bnoordhuis) UV_EINVAL or maybe UV_EBUSY. */

  if (handle->delayed_error != 0)
    goto out;

  err = maybe_new_socket(handle,
                         addr->sa_family,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  if (err)
    return err;

  if (uv__is_ipv6_link_local(addr)) {
    memcpy(&tmp6, addr, sizeof(tmp6));
    if (tmp6.sin6_scope_id == 0) {
      tmp6.sin6_scope_id = uv__ipv6_link_local_scope_id();
      addr = (void*) &tmp6;
    }
  }

  do {
    errno = 0;
    r = connect(uv__stream_fd(handle), addr, addrlen);
  } while (r == -1 && errno == EINTR);

  /* We not only check the return value, but also check the errno != 0.
   * Because in rare cases connect() will return -1 but the errno
   * is 0 (for example, on Android 4.3, OnePlus phone A0001_12_150227)
   * and actually the tcp three-way handshake is completed.
   */
  if (r == -1 && errno != 0) {
    if (errno == EINPROGRESS)
      ; /* not an error */
    else if (errno == ECONNREFUSED
#if defined(__OpenBSD__)
      || errno == EINVAL
#endif
      )
    /* If we get ECONNREFUSED (Solaris) or EINVAL (OpenBSD) wait until the
     * next tick to report the error. Solaris and OpenBSD wants to report
     * immediately -- other unixes want to wait.
     */
      handle->delayed_error = UV__ERR(ECONNREFUSED);
    else
      return UV__ERR(errno);
  }

out:

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->cb = cb;
  req->handle = (uv_stream_t*) handle;
  uv__queue_init(&req->queue);
  handle->connect_req = req;

  uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

  if (handle->delayed_error)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}